

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

easy_pollset * mev_add_new_conn_pollset(connectdata *conn)

{
  CURLcode CVar1;
  easy_pollset *ps;
  connectdata *conn_local;
  
  conn_local = (connectdata *)(*Curl_ccalloc)(1,0x20);
  if (conn_local == (connectdata *)0x0) {
    conn_local = (connectdata *)0x0;
  }
  else {
    CVar1 = Curl_conn_meta_set(conn,"meta:mev:ps",conn_local,mev_pollset_dtor);
    if (CVar1 != CURLE_OK) {
      conn_local = (connectdata *)0x0;
    }
  }
  return (easy_pollset *)conn_local;
}

Assistant:

static struct easy_pollset*
mev_add_new_conn_pollset(struct connectdata *conn)
{
  struct easy_pollset *ps;

  ps = calloc(1, sizeof(*ps));
  if(!ps)
    return NULL;
  if(Curl_conn_meta_set(conn, CURL_META_MEV_POLLSET, ps, mev_pollset_dtor))
    return NULL;
  return ps;
}